

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O2

void __thiscall Am_Inter_Location::Install(Am_Inter_Location *this,Am_Object *object,bool growing)

{
  Am_Location_Value_Control AVar1;
  bool bVar2;
  Am_Slot_Key key;
  int iVar3;
  Am_Value *pAVar4;
  Am_Inter_Location_Data *pAVar5;
  int c;
  int b;
  int a;
  int d;
  Am_Object owner;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)object);
  pAVar5 = this->data;
  a = (pAVar5->data).rect.left;
  b = (pAVar5->data).rect.top;
  c = (pAVar5->data).rect.width;
  d = (pAVar5->data).rect.height;
  bVar2 = Am_Object::Valid(&pAVar5->ref_obj);
  pAVar5 = this->data;
  if (bVar2) {
    bVar2 = Am_Object::operator!=(&owner,&pAVar5->ref_obj);
    pAVar5 = this->data;
    if (bVar2) {
      Am_Translate_Coordinates(&pAVar5->ref_obj,a,b,&owner,&a,&b);
      pAVar5 = this->data;
      if (pAVar5->as_line == true) {
        Am_Translate_Coordinates(&pAVar5->ref_obj,c,d,&owner,&c,&d);
        pAVar5 = this->data;
      }
    }
  }
  if (pAVar5->as_line == true) {
    if (pAVar5->a_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x8b,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      a = iVar3 + (pAVar5->data).rect.left;
    }
    if (pAVar5->b_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x8c,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      b = iVar3 + (pAVar5->data).rect.top;
    }
    if (pAVar5->c_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x8d,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      c = iVar3 + (pAVar5->data).rect.width;
    }
    if (pAVar5->d_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x8e,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      d = iVar3 + (pAVar5->data).rect.height;
    }
    if (pAVar5->a_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x8b,a,0);
      pAVar5 = this->data;
    }
    if (pAVar5->b_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x8c,b,0);
      pAVar5 = this->data;
    }
    if (pAVar5->c_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x8d,c,0);
      pAVar5 = this->data;
    }
    key = 0x8e;
    AVar1 = pAVar5->d_control;
  }
  else {
    if (pAVar5->a_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      a = iVar3 + (pAVar5->data).rect.left;
    }
    if (pAVar5->b_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x65,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      b = iVar3 + (pAVar5->data).rect.top;
    }
    if (pAVar5->a_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,100,a,0);
      pAVar5 = this->data;
    }
    if (pAVar5->b_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x65,b,0);
    }
    if (!growing) goto LAB_001bfd52;
    pAVar5 = this->data;
    if (pAVar5->c_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x66,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      c = iVar3 + (pAVar5->data).rect.width;
    }
    if (pAVar5->d_control == Am_LOCATION_RELATIVE) {
      pAVar4 = Am_Object::Get(object,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = this->data;
      d = iVar3 + (pAVar5->data).rect.height;
    }
    if (pAVar5->c_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x66,c,0);
      pAVar5 = this->data;
    }
    key = 0x67;
    AVar1 = pAVar5->d_control;
  }
  if (AVar1 != Am_LOCATION_NOT_USED) {
    Am_Object::Set(object,key,d,0);
  }
LAB_001bfd52:
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

void
Am_Inter_Location::Install(Am_Object &object, bool growing) const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  Am_Object owner = object.Get_Owner();
  int a = data->data.line.x1;
  int b = data->data.line.y1;
  int c = data->data.line.x2;
  int d = data->data.line.y2;

  if (data->ref_obj.Valid() && owner != data->ref_obj) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "Translating set coordinates from "
                             << data->ref_obj << " to " << owner);
    Am_Translate_Coordinates(data->ref_obj, a, b, owner, a, b);
    if (data->as_line)
      Am_Translate_Coordinates(data->ref_obj, c, d, owner, c, d);
  }
  Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING,
                              "++Object setting obj position=" << object);
  if (data->as_line) {
    if (data->a_control == Am_LOCATION_RELATIVE)
      a = (int)object.Get(Am_X1) + data->data.line.x1;
    if (data->b_control == Am_LOCATION_RELATIVE)
      b = (int)object.Get(Am_Y1) + data->data.line.y1;
    if (data->c_control == Am_LOCATION_RELATIVE)
      c = (int)object.Get(Am_X2) + data->data.line.x2;
    if (data->d_control == Am_LOCATION_RELATIVE)
      d = (int)object.Get(Am_Y2) + data->data.line.y2;

    if (data->a_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " X1=" << a);
      object.Set(Am_X1, a); // , Am_NO_ANIMATION
    }
    if (data->b_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " Y1=" << b);
      object.Set(Am_Y1, b); // , Am_NO_ANIMATION
    }
    if (data->c_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " X2=" << c);
      object.Set(Am_X2, c); // , Am_NO_ANIMATION
    }
    if (data->d_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " Y2=" << d);
      object.Set(Am_Y2, d); // , Am_NO_ANIMATION
    }
  } else {
    if (data->a_control == Am_LOCATION_RELATIVE)
      a = (int)object.Get(Am_LEFT) + data->data.rect.left;
    if (data->b_control == Am_LOCATION_RELATIVE)
      b = (int)object.Get(Am_TOP) + data->data.rect.top;

    if (data->a_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " left=" << a);
      object.Set(Am_LEFT, a); // , Am_NO_ANIMATION
    }
    if (data->b_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " top=" << b);
      object.Set(Am_TOP, b); // , Am_NO_ANIMATION
    }
    if (growing) {
      if (data->c_control == Am_LOCATION_RELATIVE)
        c = (int)object.Get(Am_WIDTH) + data->data.rect.width;
      if (data->d_control == Am_LOCATION_RELATIVE)
        d = (int)object.Get(Am_HEIGHT) + data->data.rect.height;

      if (data->c_control != Am_LOCATION_NOT_USED) {
        Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " width=" << c);
        object.Set(Am_WIDTH, c); // , Am_NO_ANIMATION
      }
      if (data->d_control != Am_LOCATION_NOT_USED) {
        Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " height=" << d);
        object.Set(Am_HEIGHT, d); // , Am_NO_ANIMATION
      }
    }
  }
  Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, std::endl << std::flush);
}